

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevolute.cpp
# Opt level: O1

void __thiscall chrono::ChLinkRevolute::ChLinkRevolute(ChLinkRevolute *this)

{
  ChQuaternion<double> local_38;
  
  ChLink::ChLink(&this->super_ChLink);
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkRevolute_00b451a8;
  local_38.m_data[0] = 1.0;
  local_38.m_data[1] = 0.0;
  local_38.m_data[2] = 0.0;
  local_38.m_data[3] = 0.0;
  (this->m_frame1)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  (this->m_frame1).coord.pos.m_data[0] = 0.0;
  (this->m_frame1).coord.pos.m_data[1] = 0.0;
  (this->m_frame1).coord.pos.m_data[2] = 0.0;
  (this->m_frame1).coord.rot.m_data[0] = 1.0;
  (this->m_frame1).coord.rot.m_data[1] = 0.0;
  (this->m_frame1).coord.rot.m_data[2] = 0.0;
  (this->m_frame1).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&(this->m_frame1).Amatrix,&local_38);
  local_38.m_data[0] = 1.0;
  local_38.m_data[1] = 0.0;
  local_38.m_data[2] = 0.0;
  local_38.m_data[3] = 0.0;
  (this->m_frame2)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  (this->m_frame2).coord.pos.m_data[0] = 0.0;
  (this->m_frame2).coord.pos.m_data[1] = 0.0;
  (this->m_frame2).coord.pos.m_data[2] = 0.0;
  (this->m_frame2).coord.rot.m_data[0] = 1.0;
  (this->m_frame2).coord.rot.m_data[1] = 0.0;
  (this->m_frame2).coord.rot.m_data[2] = 0.0;
  (this->m_frame2).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&(this->m_frame2).Amatrix,&local_38);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_x);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_y);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_z);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_uw);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_vw);
  this->m_multipliers[0] = 0.0;
  this->m_multipliers[1] = 0.0;
  this->m_multipliers[2] = 0.0;
  this->m_multipliers[3] = 0.0;
  this->m_multipliers[4] = 0.0;
  return;
}

Assistant:

ChLinkRevolute::ChLinkRevolute() {
    for (int i = 0; i < 5; i++) {
        m_multipliers[i] = 0;
    }
}